

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::SmalltalkImage::stQuitPrimitive(InterpreterProxy *interpreter)

{
  int iVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SmallIntegerValue SVar2;
  int __status;
  Oop exitCodeObject;
  anon_union_8_4_0eb573b0_for_Oop_0 local_18;
  
  local_18 = in_RAX;
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  __status = 0;
  if (CONCAT44(extraout_var,iVar1) == 1) {
    __status = 0;
    local_18._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_18.uintValue._4_4_ = extraout_var_00;
    if ((local_18._0_4_ & 1) != 0) {
      SVar2 = Oop::decodeSmallInteger((Oop *)&local_18);
      __status = (int)SVar2;
    }
  }
  exit(__status);
}

Assistant:

int SmalltalkImage::stQuitPrimitive(InterpreterProxy *interpreter)
{
    int exitCode = 0;
    if (interpreter->getArgumentCount() == 1)
    {
        auto exitCodeObject = interpreter->getTemporary(0);
        if (exitCodeObject.isSmallInteger())
            exitCode = (int)exitCodeObject.decodeSmallInteger();
    }

    exit(exitCode);
    // Should never reach here.
}